

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTagType(BinaryReaderIR *this,Index index,Index sig_index)

{
  Module *this_00;
  Index index_00;
  pointer pTVar1;
  unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> local_c0;
  Location local_b8;
  Var local_98;
  Tag *local_50;
  Tag *tag;
  undefined1 local_28 [8];
  __single_object field;
  Index sig_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
  super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl._0_4_ = sig_index;
  field._M_t.super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
  super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&tag,this);
  std::make_unique<wabt::TagModuleField,wabt::Location>((Location *)local_28);
  pTVar1 = std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::
           operator->((unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                       *)local_28);
  index_00 = (Index)field._M_t.
                    super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                    .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl;
  local_50 = &pTVar1->tag;
  GetLocation(&local_b8,this);
  Var::Var(&local_98,index_00,&local_b8);
  SetFuncDeclaration(this,&(pTVar1->tag).decl,&local_98);
  Var::~Var(&local_98);
  this_00 = this->module_;
  std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::unique_ptr
            (&local_c0,
             (unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> *)
             local_28);
  Module::AppendField(this_00,&local_c0);
  std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::~unique_ptr
            (&local_c0);
  (this->module_->features_used).exceptions = true;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> *)
             local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTagType(Index index, Index sig_index) {
  auto field = std::make_unique<TagModuleField>(GetLocation());
  Tag& tag = field->tag;
  SetFuncDeclaration(&tag.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  module_->features_used.exceptions = true;
  return Result::Ok;
}